

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitModuleExportAccess
          (ByteCodeGenerator *this,Symbol *sym,OpCode opcode,RegSlot location,FuncInfo *funcInfo)

{
  bool bVar1;
  uint32 slotId1;
  uint32 slotId2;
  ByteCodeWriter *pBVar2;
  FuncInfo *funcInfo_local;
  RegSlot location_local;
  OpCode opcode_local;
  Symbol *sym_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = EnsureSymbolModuleSlots(this,sym,funcInfo);
  if (bVar1) {
    pBVar2 = Writer(this);
    slotId1 = Symbol::GetModuleIndex(sym);
    slotId2 = Symbol::GetScopeSlot(sym);
    Js::ByteCodeWriter::SlotI2(pBVar2,opcode,location,slotId1,slotId2);
  }
  else {
    pBVar2 = Writer(this);
    Js::ByteCodeWriter::W1(pBVar2,RuntimeReferenceError,0x43f);
    if (opcode == LdModuleSlot) {
      pBVar2 = Writer(this);
      Js::ByteCodeWriter::Reg1(pBVar2,LdUndef,location);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitModuleExportAccess(Symbol* sym, Js::OpCode opcode, Js::RegSlot location, FuncInfo* funcInfo)
{
    if (EnsureSymbolModuleSlots(sym, funcInfo))
    {
        this->Writer()->SlotI2(opcode, location, sym->GetModuleIndex(), sym->GetScopeSlot());
    }
    else
    {
        this->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(ERRInvalidExportName));

        if (opcode == Js::OpCode::LdModuleSlot)
        {
            this->Writer()->Reg1(Js::OpCode::LdUndef, location);
        }
    }
}